

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_inscribe(parser *p)

{
  uint32_t uVar1;
  wchar_t tval;
  wchar_t sval;
  byte *pbVar2;
  char *pcVar3;
  object_kind *poVar4;
  prefs_data *d;
  object_kind *kind;
  wchar_t svi;
  wchar_t tvi;
  parser *p_local;
  
  pbVar2 = (byte *)parser_priv(p);
  if (pbVar2 != (byte *)0x0) {
    if ((*pbVar2 & 1) == 0) {
      pcVar3 = parser_getsym(p,"tval");
      tval = tval_find_idx(pcVar3);
      if (tval < L'\0') {
        p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
      }
      else {
        pcVar3 = parser_getsym(p,"sval");
        sval = lookup_sval(tval,pcVar3);
        if (sval < L'\0') {
          p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_SVAL;
        }
        else {
          poVar4 = lookup_kind(tval,sval);
          if (poVar4 == (object_kind *)0x0) {
            p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_SVAL;
          }
          else {
            uVar1 = poVar4->kidx;
            pcVar3 = parser_getstr(p,"text");
            add_autoinscription((int16_t)uVar1,pcVar3,true);
            p_local._4_4_ = PARSE_ERROR_NONE;
          }
        }
      }
    }
    else {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                ,0x3a8,"enum parser_error parse_prefs_inscribe(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_inscribe(struct parser *p)
{
	int tvi, svi;
	struct object_kind *kind;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	tvi = tval_find_idx(parser_getsym(p, "tval"));
	if (tvi < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;

	svi = lookup_sval(tvi, parser_getsym(p, "sval"));
	if (svi < 0)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	kind = lookup_kind(tvi, svi);
	if (!kind)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	add_autoinscription(kind->kidx, parser_getstr(p, "text"), true);

	return PARSE_ERROR_NONE;
}